

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

vector<Client_*,_std::allocator<Client_*>_> * __thiscall Server::Select(Server *this,double timeout)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  __fd_mask *p_Var2;
  int iVar3;
  Client *this_00;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  fd_set *__arr;
  undefined8 *puVar7;
  uint __i;
  long lVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  impl_ *piVar11;
  _List_node_base *p_Var12;
  Client *client;
  timeval timeout_val;
  
  timeout_val.tv_sec = (__time_t)timeout;
  timeout_val.tv_usec = (__suseconds_t)((timeout - (double)timeout_val.tv_sec) * 1000000.0);
  if ((Select(double)::selected == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Select(double)::selected), iVar6 != 0)) {
    Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Select::selected.super__Vector_base<Client_*,_std::allocator<Client_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::vector<Client_*,_std::allocator<Client_*>_>::~vector,&Select::selected,
                 &__dso_handle);
    __cxa_guard_release(&Select(double)::selected);
  }
  piVar11 = this->impl;
  iVar6 = piVar11->sock;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    (piVar11->read_fds).fds_bits[lVar8] = 0;
  }
  piVar11 = this->impl;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    (piVar11->write_fds).fds_bits[lVar8] = 0;
  }
  piVar11 = this->impl;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    (piVar11->except_fds).fds_bits[lVar8] = 0;
  }
  plVar1 = &this->clients;
  p_Var10 = (_List_node_base *)plVar1;
  while (p_Var10 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var10->_M_next)->_M_impl)
                   ._M_node.super__List_node_base._M_next, p_Var10 != (_List_node_base *)plVar1) {
    lVar8 = (long)p_Var10[1]._M_next;
    piVar11 = this->impl;
    if (*(long *)(lVar8 + 0x60) != *(long *)(lVar8 + 0x38)) {
      p_Var2 = (piVar11->read_fds).fds_bits + **(int **)(lVar8 + 8) / 0x40;
      *p_Var2 = *p_Var2 | 1L << ((byte)**(int **)(lVar8 + 8) & 0x3f);
      piVar11 = this->impl;
    }
    if (*(long *)(lVar8 + 0x98) != 0) {
      p_Var2 = (piVar11->write_fds).fds_bits + **(int **)(lVar8 + 8) / 0x40;
      *p_Var2 = *p_Var2 | 1L << ((byte)**(int **)(lVar8 + 8) & 0x3f);
      piVar11 = this->impl;
    }
    p_Var2 = (piVar11->except_fds).fds_bits + **(int **)(lVar8 + 8) / 0x40;
    *p_Var2 = *p_Var2 | 1L << ((byte)**(int **)(lVar8 + 8) & 0x3f);
    if (iVar6 < **(int **)(lVar8 + 8)) {
      iVar6 = **(int **)(lVar8 + 8);
    }
  }
  iVar3 = this->impl->sock;
  p_Var2 = (this->impl->except_fds).fds_bits + iVar3 / 0x40;
  *p_Var2 = *p_Var2 | 1L << ((byte)iVar3 & 0x3f);
  piVar11 = this->impl;
  iVar6 = select(iVar6 + 1,(fd_set *)piVar11,(fd_set *)&piVar11->write_fds,
                 (fd_set *)&piVar11->except_fds,(timeval *)&timeout_val);
  if (iVar6 == -1) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    OSErrorString();
    puVar7[1] = ErrorBuf;
    *puVar7 = &PTR__exception_0020b350;
    __cxa_throw(puVar7,&Socket_SelectFailed::typeinfo,std::exception::~exception);
  }
  p_Var10 = (_List_node_base *)plVar1;
  if (0 < iVar6) {
    iVar6 = this->impl->sock;
    p_Var12 = (_List_node_base *)plVar1;
    if (((ulong)(this->impl->except_fds).fds_bits[iVar6 / 0x40] >> ((long)iVar6 % 0x40 & 0x3fU) & 1)
        != 0) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = &PTR__exception_0020b328;
      puVar7[1] = "There was an exception on the listening socket.";
      __cxa_throw(puVar7,&Socket_Exception::typeinfo,std::exception::~exception);
    }
    while (p_Var12 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var12->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var12 != (_List_node_base *)plVar1) {
      this_00 = (Client *)p_Var12[1]._M_next;
      piVar11 = this->impl;
      iVar6 = ((this_00->impl)._M_t.
               super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
               super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
               super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock;
      uVar4 = (long)iVar6 % 0x40;
      lVar8 = (long)(iVar6 / 0x40);
      uVar9 = 1L << ((byte)uVar4 & 0x3f);
      if (((ulong)(piVar11->except_fds).fds_bits[lVar8] >> (uVar4 & 0x3f) & 1) != 0)
      goto LAB_00165302;
      if (((piVar11->read_fds).fds_bits[lVar8] & uVar9) != 0) {
        bVar5 = Client::DoRecv(this_00);
        if (!bVar5) goto LAB_00165302;
        piVar11 = this->impl;
        iVar6 = ((this_00->impl)._M_t.
                 super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
                 super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
                 super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sock;
        lVar8 = (long)(iVar6 / 0x40);
        uVar9 = 1L << ((byte)(iVar6 % 0x40) & 0x3f);
      }
      if ((((piVar11->write_fds).fds_bits[lVar8] & uVar9) != 0) &&
         (bVar5 = Client::DoSend(this_00), !bVar5)) {
LAB_00165302:
        Client::Close(this_00,true);
      }
    }
  }
  while (p_Var10 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var10->_M_next)->_M_impl)
                   ._M_node.super__List_node_base._M_next, p_Var10 != (_List_node_base *)plVar1) {
    client = (Client *)p_Var10[1]._M_next;
    if ((client->recv_buffer_used != 0) || (iVar6 = (**client->_vptr_Client)(), (char)iVar6 != '\0')
       ) {
      std::vector<Client_*,_std::allocator<Client_*>_>::push_back(&Select::selected,&client);
    }
  }
  return &Select::selected;
}

Assistant:

std::vector<Client *> *Server::Select(double timeout)
{
	long tsecs = long(timeout);
	timeval timeout_val = {tsecs, long((timeout - double(tsecs))*1000000)};
	static std::vector<Client *> selected;
	SOCKET nfds = this->impl->sock;
	int result;

	FD_ZERO(&this->impl->read_fds);
	FD_ZERO(&this->impl->write_fds);
	FD_ZERO(&this->impl->except_fds);

	UTIL_FOREACH(this->clients, client)
	{
		if (client->recv_buffer_used != client->recv_buffer.length())
		{
			FD_SET(client->impl->sock, &this->impl->read_fds);
		}

		if (client->send_buffer_used > 0)
		{
			FD_SET(client->impl->sock, &this->impl->write_fds);
		}

		FD_SET(client->impl->sock, &this->impl->except_fds);

		if (client->impl->sock > nfds)
		{
			nfds = client->impl->sock;
		}
	}

	FD_SET(this->impl->sock, &this->impl->except_fds);

	result = select(nfds+1, &this->impl->read_fds, &this->impl->write_fds, &this->impl->except_fds, &timeout_val);

	if (result == -1)
	{
		throw Socket_SelectFailed(OSErrorString());
	}

	if (result > 0)
	{
		if (FD_ISSET(this->impl->sock, &this->impl->except_fds))
		{
			throw Socket_Exception("There was an exception on the listening socket.");
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (FD_ISSET(client->impl->sock, &this->impl->except_fds))
			{
				client->Close(true);
				continue;
			}

			if (FD_ISSET(client->impl->sock, &this->impl->read_fds))
			{
				if (!client->DoRecv())
				{
					client->Close(true);
					continue;
				}
			}

			if (FD_ISSET(client->impl->sock, &this->impl->write_fds))
			{
				if (!client->DoSend())
				{
					client->Close(true);
					continue;
				}
			}
		}
	}

	UTIL_FOREACH(this->clients, client)
	{
		if (client->recv_buffer_used > 0 || client->NeedTick())
		{
			selected.push_back(client);
		}
	}

	return &selected;
}